

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int MakeGenericMessage(http_method_t method,char *url_str,membuffer *request,uri_type *url,
                      int contentLength,char *contentType,UpnpString *headers)

{
  uri_type *buf;
  membuffer *urlstr;
  size_t urlstrlen;
  char *pcVar1;
  undefined8 in_stack_ffffffffffffff98;
  char *local_50;
  char *hoststr;
  size_t hostlen;
  char *pcStack_38;
  int ret_code;
  char *contentType_local;
  uri_type *puStack_28;
  int contentLength_local;
  uri_type *url_local;
  membuffer *request_local;
  char *url_str_local;
  http_method_t method_local;
  
  hostlen._4_4_ = 0;
  hoststr = (char *)0x0;
  pcStack_38 = contentType;
  contentType_local._4_4_ = contentLength;
  puStack_28 = url;
  url_local = (uri_type *)request;
  request_local = (membuffer *)url_str;
  url_str_local._0_4_ = method;
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x3ef,"URL: %s method: %d\n"
             ,url_str,CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),method));
  urlstr = request_local;
  urlstrlen = strlen((char *)request_local);
  hostlen._4_4_ = http_FixStrUrl((char *)urlstr,urlstrlen,puStack_28);
  url_str_local._4_4_ = hostlen._4_4_;
  if (hostlen._4_4_ == 0) {
    membuffer_init((membuffer *)url_local);
    hostlen._4_4_ =
         http_MakeMessage((membuffer *)url_local,1,1,"Q",(ulong)(http_method_t)url_str_local,
                          (puStack_28->pathquery).buff,(puStack_28->pathquery).size);
    buf = url_local;
    if (hostlen._4_4_ == 0) {
      if (headers == (UpnpString *)0x0) {
        hostlen._4_4_ = get_hoststr((char *)request_local,&local_50,(size_t *)&hoststr);
        if (hostlen._4_4_ != 0) {
          return hostlen._4_4_;
        }
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x40e,
                   "HOSTNAME : %s Length : %zu\n",local_50,hoststr);
        hostlen._4_4_ =
             http_MakeMessage((membuffer *)url_local,1,1,"sbcDCU","HOST: ",local_50,hoststr);
      }
      else {
        pcVar1 = UpnpString_get_String(headers);
        hostlen._4_4_ = http_MakeMessage((membuffer *)buf,1,1,"s",pcVar1);
      }
    }
    if ((hostlen._4_4_ == 0) && (pcStack_38 != (char *)0x0)) {
      hostlen._4_4_ = http_MakeMessage((membuffer *)url_local,1,1,"T",pcStack_38);
    }
    if (hostlen._4_4_ == 0) {
      if (contentType_local._4_4_ < 0) {
        if (contentType_local._4_4_ == -3) {
          hostlen._4_4_ = http_MakeMessage((membuffer *)url_local,1,1,"Kc");
        }
        else if (contentType_local._4_4_ == -4) {
          hostlen._4_4_ = http_MakeMessage((membuffer *)url_local,1,1,"c");
        }
        else {
          hostlen._4_4_ = -0x65;
        }
      }
      else {
        hostlen._4_4_ =
             http_MakeMessage((membuffer *)url_local,1,1,"Nc",(long)contentType_local._4_4_);
      }
    }
    if (hostlen._4_4_ == 0) {
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x439,
                 "HTTP Buffer:\n%s\n----------END--------\n",*(undefined8 *)url_local);
      url_str_local._4_4_ = 0;
    }
    else {
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x431,
                 "HTTP Makemessage failed\n");
      membuffer_destroy((membuffer *)url_local);
      url_str_local._4_4_ = hostlen._4_4_;
    }
  }
  return url_str_local._4_4_;
}

Assistant:

int MakeGenericMessage(http_method_t method,
	const char *url_str,
	membuffer *request,
	uri_type *url,
	int contentLength,
	const char *contentType,
	const UpnpString *headers)
{
	int ret_code = 0;
	size_t hostlen = 0;
	const char *hoststr;

	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"URL: %s method: %d\n",
		url_str,
		method);
	ret_code = http_FixStrUrl(url_str, strlen(url_str), url);
	if (ret_code != UPNP_E_SUCCESS)
		return ret_code;
	/* make msg */
	membuffer_init(request);
	ret_code = http_MakeMessage(request,
		1,
		1,
		"Q",
		method,
		url->pathquery.buff,
		url->pathquery.size);
	/* add request headers if specified, otherwise use default headers */
	if (ret_code == 0) {
		if (headers) {
			ret_code = http_MakeMessage(request,
				1,
				1,
				"s",
				UpnpString_get_String(headers));
		} else {
			ret_code = get_hoststr(url_str, &hoststr, &hostlen);
			if (ret_code != UPNP_E_SUCCESS)
				return ret_code;
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"HOSTNAME : %s Length : %" PRIzu "\n",
				hoststr,
				hostlen);
			ret_code = http_MakeMessage(request,
				1,
				1,
				"s"
				"bcDCU",
				"HOST: ",
				hoststr,
				hostlen);
		}
	}

	/* add the content-type header */
	if (ret_code == 0 && contentType) {
		ret_code = http_MakeMessage(request, 1, 1, "T", contentType);
	}
	/* add content-length header. */
	if (ret_code == 0) {
		if (contentLength >= 0)
			ret_code = http_MakeMessage(
				request, 1, 1, "Nc", (off_t)contentLength);
		else if (contentLength == UPNP_USING_CHUNKED)
			ret_code = http_MakeMessage(request, 1, 1, "Kc");
		else if (contentLength == UPNP_UNTIL_CLOSE)
			ret_code = http_MakeMessage(request, 1, 1, "c");
		else
			ret_code = UPNP_E_INVALID_PARAM;
	}
	if (ret_code != 0) {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HTTP Makemessage failed\n");
		membuffer_destroy(request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request->buf);

	return UPNP_E_SUCCESS;
}